

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box_renderer.cpp
# Opt level: O3

string * __thiscall
duckdb::BoxRenderer::FormatNumber(string *__return_storage_ptr__,BoxRenderer *this,string *input)

{
  pointer pcVar1;
  ulong uVar2;
  string *number;
  char cVar3;
  ulong uVar4;
  ulong uVar5;
  string *__range1;
  
  if ((this->config).large_number_rendering == ALL) {
    TryFormatLargeNumber(__return_storage_ptr__,this,input);
    if (__return_storage_ptr__->_M_string_length != 0) {
      return __return_storage_ptr__;
    }
    pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 != &__return_storage_ptr__->field_2) {
      operator_delete(pcVar1);
    }
  }
  if ((this->config).thousand_separator == '\0' && (this->config).decimal_separator == '\0') {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (input->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + input->_M_string_length);
  }
  else {
    uVar2 = input->_M_string_length;
    cVar3 = (char)__return_storage_ptr__;
    if (uVar2 == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      uVar5 = 0;
      uVar2 = 0;
    }
    else {
      uVar4 = 0;
      do {
        uVar5 = uVar4;
        if (9 < (byte)((input->_M_dataplus)._M_p[uVar4] - 0x30U)) break;
        uVar4 = uVar4 + 1;
        uVar5 = uVar2;
      } while (uVar2 != uVar4);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      if (uVar5 == 0) {
        uVar5 = 0;
      }
      else {
        uVar2 = 3;
        if (uVar5 % 3 != 0) {
          uVar2 = uVar5 % 3;
        }
        uVar4 = 0;
        do {
          if ((uVar4 == uVar2) && (uVar2 = uVar4, (this->config).thousand_separator != '\0')) {
            ::std::__cxx11::string::push_back(cVar3);
            uVar2 = uVar4 + 3;
          }
          ::std::__cxx11::string::push_back(cVar3);
          uVar4 = uVar4 + 1;
        } while (uVar5 != uVar4);
        uVar2 = input->_M_string_length;
      }
    }
    if (uVar5 < uVar2) {
      do {
        ::std::__cxx11::string::push_back(cVar3);
        uVar5 = uVar5 + 1;
      } while (uVar5 < input->_M_string_length);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string BoxRenderer::FormatNumber(const string &input) {
	if (config.large_number_rendering == LargeNumberRendering::ALL) {
		// when large number rendering is set to ALL, we try to format all numbers as large numbers
		auto number = TryFormatLargeNumber(input);
		if (!number.empty()) {
			return number;
		}
	}
	if (config.decimal_separator == '\0' && config.thousand_separator == '\0') {
		// no thousand separator
		return input;
	}
	// first check how many digits there are (preceding any decimal point)
	idx_t character_count = 0;
	for (auto c : input) {
		if (!StringUtil::CharacterIsDigit(c)) {
			break;
		}
		character_count++;
	}
	// find the position of the first thousand separator
	idx_t separator_position = character_count % 3 == 0 ? 3 : character_count % 3;
	// now add the thousand separators
	string result;
	for (idx_t c = 0; c < character_count; c++) {
		if (c == separator_position && config.thousand_separator != '\0') {
			result += config.thousand_separator;
			separator_position += 3;
		}
		result += input[c];
	}
	// add any remaining characters
	for (idx_t c = character_count; c < input.size(); c++) {
		if (input[c] == '.' && config.decimal_separator != '\0') {
			result += config.decimal_separator;
		} else {
			result += input[c];
		}
	}
	return result;
}